

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall_p.h
# Opt level: O1

void __thiscall
QDBusPendingCallWatcherHelper::emitSignals
          (QDBusPendingCallWatcherHelper *this,QDBusMessage *replyMessage,QDBusMessage *sentMessage)

{
  MessageType MVar1;
  long in_FS_OFFSET;
  QDBusError QStack_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  MVar1 = QDBusMessage::type(replyMessage);
  if (MVar1 == ReplyMessage) {
    reply(this,replyMessage);
  }
  else {
    QDBusError::QDBusError(&QStack_68,replyMessage);
    error(this,&QStack_68,sentMessage);
    if (&(QStack_68.nm.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_68.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_68.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_68.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_68.nm.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(QStack_68.msg.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_68.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_68.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_68.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(QStack_68.msg.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  finished(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emitSignals(const QDBusMessage &replyMessage, const QDBusMessage &sentMessage)
    {
        if (replyMessage.type() == QDBusMessage::ReplyMessage)
            emit reply(replyMessage);
        else
            emit error(QDBusError(replyMessage), sentMessage);
        emit finished();
    }